

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O2

void __thiscall internalJSONNode::Fetch(internalJSONNode *this)

{
  if (this->fetched == false) {
    switch(this->_type) {
    case '\x01':
      FetchString(this);
      break;
    case '\x02':
      FetchNumber(this);
      break;
    default:
      Nullify(this);
      break;
    case '\x04':
      FetchArray(this);
      break;
    case '\x05':
      FetchNode(this);
    }
    this->fetched = true;
  }
  return;
}

Assistant:

void internalJSONNode::Fetch(void) const json_nothrow {
	   if (fetched) return;
	   switch (type()){
		  case JSON_STRING:
			 FetchString();
			 break;
		  case JSON_NODE:
			 FetchNode();
			 break;
		  case JSON_ARRAY:
			 FetchArray();
			 break;
		  case JSON_NUMBER:
			 FetchNumber();
			 break;
		  #if defined JSON_DEBUG || defined JSON_SAFE
			 default:
				JSON_FAIL(JSON_TEXT("Fetching an unknown type"));
				Nullify();
		  #endif 
	   }
	   fetched = true;
    }